

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

common_sampler * common_sampler_clone(common_sampler *gsmpl)

{
  llama_token_data *plVar1;
  size_t sVar2;
  bool bVar3;
  undefined7 uVar4;
  common_sampler *this;
  llama_sampler *plVar5;
  
  this = (common_sampler *)operator_new(0x1a0);
  common_params_sampling::common_params_sampling((common_params_sampling *)this,&gsmpl->params);
  plVar5 = (llama_sampler *)llama_sampler_clone(gsmpl->grmr);
  this->grmr = plVar5;
  plVar5 = (llama_sampler *)llama_sampler_clone(gsmpl->chain);
  this->chain = plVar5;
  ring_buffer<int>::ring_buffer(&this->prev,&gsmpl->prev);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector(&this->cur,&gsmpl->cur);
  plVar1 = (gsmpl->cur_p).data;
  sVar2 = (gsmpl->cur_p).size;
  bVar3 = (gsmpl->cur_p).sorted;
  uVar4 = *(undefined7 *)&(gsmpl->cur_p).field_0x19;
  (this->cur_p).selected = (gsmpl->cur_p).selected;
  (this->cur_p).sorted = bVar3;
  *(undefined7 *)&(this->cur_p).field_0x19 = uVar4;
  (this->cur_p).data = plVar1;
  (this->cur_p).size = sVar2;
  return this;
}

Assistant:

struct common_sampler * common_sampler_clone(common_sampler * gsmpl) {
    return new common_sampler {
        /* .params = */ gsmpl->params,
        /* .grmr   = */ llama_sampler_clone(gsmpl->grmr),
        /* .chain  = */ llama_sampler_clone(gsmpl->chain),
        /* .prev   = */ gsmpl->prev,
        /* .cur    = */ gsmpl->cur,
        /* .cur_p  = */ gsmpl->cur_p,
    };
}